

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O1

int Col_ListIterBegin(ColListIterator *it,Col_Word list,size_t index)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  
  it->list = list;
  sVar1 = Col_ListLength(list);
  it->length = sVar1;
  sVar3 = index;
  iVar2 = 0;
  if (sVar1 <= index) {
    sVar1 = Col_ListLoopLength(list);
    sVar3 = it->length;
    iVar2 = 0;
    if (sVar1 != 0) {
      sVar3 = (index - (sVar3 - sVar1)) % sVar1 + (sVar3 - sVar1);
      iVar2 = 1;
    }
  }
  it->index = sVar3;
  (it->chunk).first = 0xffffffffffffffff;
  return iVar2;
}

Assistant:

int
Col_ListIterBegin(
    Col_ListIterator it,    /*!< Iterator to initialize. */
    Col_Word list,          /*!< List to iterate over. */
    size_t index)           /*!< Index of first element to iterate. */
{
    int looped=0;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_LIST,list} */
    TYPECHECK_LIST(list) {
        Col_ListIterSetNull(it);
        return 0;
    }

    it->list = list;
    it->length = Col_ListLength(list);
    if (index >= it->length) {
        size_t loop = Col_ListLoopLength(list);
        if (!loop) {
            /*
             * End of list.
             */

            index = it->length;
        } else {
            /*
             * Cyclic list. Normalize index.
             */

            looped = 1;
            index = (index - (it->length-loop)) % loop + (it->length-loop);
        }
    }
    it->index = index;

    /*
     * Traversal info will be lazily computed.
     */

    it->chunk.first = SIZE_MAX;

    return looped;
}